

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::ShaderAtomicOpCase
          (ShaderAtomicOpCase *this,Context *context,char *name,char *funcName,
          AtomicOperandType operandType,DataType type,Precision precision,UVec3 *workGroupSize)

{
  char *__s;
  allocator<char> local_31;
  DataType local_30;
  AtomicOperandType local_2c;
  DataType type_local;
  AtomicOperandType operandType_local;
  char *funcName_local;
  char *name_local;
  Context *context_local;
  ShaderAtomicOpCase *this_local;
  
  local_30 = type;
  local_2c = operandType;
  _type_local = funcName;
  funcName_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,funcName);
  __s = _type_local;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAtomicOpCase_032c1248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_funcName,__s,&local_31);
  std::allocator<char>::~allocator(&local_31);
  this->m_operandType = local_2c;
  this->m_type = local_30;
  this->m_precision = precision;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_workGroupSize,workGroupSize);
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_numWorkGroups,4,4,4);
  this->m_initialValue = 0;
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

ShaderAtomicOpCase::ShaderAtomicOpCase (Context& context, const char* name, const char* funcName, AtomicOperandType operandType, DataType type, Precision precision, const UVec3& workGroupSize)
	: TestCase			(context, name, funcName)
	, m_funcName		(funcName)
	, m_operandType		(operandType)
	, m_type			(type)
	, m_precision		(precision)
	, m_workGroupSize	(workGroupSize)
	, m_numWorkGroups	(4,4,4)
	, m_initialValue	(0)
	, m_program			(DE_NULL)
{
}